

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * cleanPackageName(QString *packageName,bool *cleaned)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  QLatin1StringView latin1_09;
  QLatin1StringView latin1_10;
  QLatin1StringView latin1_11;
  QLatin1StringView latin1_12;
  QLatin1StringView latin1_13;
  QLatin1StringView latin1_14;
  QLatin1StringView latin1_15;
  QLatin1StringView latin1_16;
  QLatin1StringView latin1_17;
  QLatin1StringView latin1_18;
  QLatin1StringView latin1_19;
  QLatin1StringView latin1_20;
  QLatin1StringView latin1_21;
  QLatin1StringView latin1_22;
  QLatin1StringView latin1_23;
  QLatin1StringView latin1_24;
  QLatin1StringView latin1_25;
  QLatin1StringView latin1_26;
  QLatin1StringView latin1_27;
  QLatin1StringView latin1_28;
  QLatin1StringView latin1_29;
  QLatin1StringView latin1_30;
  QLatin1StringView latin1_31;
  QLatin1StringView latin1_32;
  QLatin1StringView latin1_33;
  QLatin1StringView latin1_34;
  QLatin1StringView latin1_35;
  QLatin1StringView latin1_36;
  QLatin1StringView latin1_37;
  QLatin1StringView latin1_38;
  QLatin1StringView latin1_39;
  QLatin1StringView latin1_40;
  QLatin1StringView latin1_41;
  QLatin1StringView latin1_42;
  QLatin1StringView latin1_43;
  QLatin1StringView latin1_44;
  QLatin1StringView latin1_45;
  QLatin1StringView latin1_46;
  QLatin1StringView latin1_47;
  bool bVar1;
  bool bVar2;
  int iVar3;
  iterator pQVar4;
  QList<QString> *pQVar5;
  QList<QString> *pQVar6;
  qsizetype qVar7;
  QChar *pQVar8;
  undefined1 *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  QLatin1String QVar10;
  qsizetype next;
  qsizetype index;
  QChar *c;
  iterator __end1;
  iterator __begin1;
  QString *__range1;
  QChar c_1;
  QString word;
  anon_class_1_0_00000001 isLegalChar;
  undefined4 in_stack_fffffffffffff5c8;
  CaseSensitivity in_stack_fffffffffffff5cc;
  anon_class_1_0_00000001 *in_stack_fffffffffffff5d0;
  anon_class_1_0_00000001 *in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  QList<QString> *in_stack_fffffffffffff5f8;
  qsizetype in_stack_fffffffffffff600;
  char *in_stack_fffffffffffff608;
  char *local_870;
  anon_class_1_0_00000001 *local_858;
  anon_class_1_0_00000001 *local_850;
  iterator local_518;
  QChar local_4ea;
  QChar local_4e8;
  QChar local_4e6;
  QChar local_4e4;
  char16_t local_4e2;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  QChar local_4c2 [602];
  QChar local_e;
  char16_t local_c;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0xaa;
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  local_518 = QString::begin((QString *)in_stack_fffffffffffff5d0);
  pQVar4 = QString::end((QString *)in_stack_fffffffffffff5d0);
  for (; local_518 != pQVar4; local_518 = local_518 + 1) {
    local_c = local_518->ucs;
    bVar1 = cleanPackageName::anon_class_1_0_00000001::operator()
                      (in_stack_fffffffffffff5d0,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffff5d8 >> 0x30));
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_e,L'_');
      local_518->ucs = local_e.ucs;
      if (in_RDX != (undefined1 *)0x0) {
        *in_RDX = 1;
      }
    }
  }
  if ((cleanPackageName(QString,bool*)::keywords == '\0') &&
     (iVar3 = __cxa_guard_acquire(&cleanPackageName(QString,bool*)::keywords), iVar3 != 0)) {
    __cxa_atexit(QList<QString>::~QList,&cleanPackageName::keywords,&__dso_handle);
    __cxa_guard_release(&cleanPackageName(QString,bool*)::keywords);
  }
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x10d9f6);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    QVar9.m_data = in_stack_fffffffffffff608;
    QVar9.m_size = in_stack_fffffffffffff600;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),QVar9)
    ;
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1.m_data = in_stack_fffffffffffff608;
    latin1.m_size = in_stack_fffffffffffff600;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),latin1
                    );
    in_stack_fffffffffffff5f8 =
         QList<QString>::operator<<
                   ((QList<QString> *)in_stack_fffffffffffff5d0,
                    (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_00.m_data = in_stack_fffffffffffff608;
    latin1_00.m_size = in_stack_fffffffffffff600;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_00);
    pQVar5 = QList<QString>::operator<<
                       ((QList<QString> *)in_stack_fffffffffffff5d0,
                        (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_01.m_data = in_stack_fffffffffffff608;
    latin1_01.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_01);
    pQVar6 = QList<QString>::operator<<
                       ((QList<QString> *)in_stack_fffffffffffff5d0,
                        (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_02.m_data = (char *)pQVar6;
    latin1_02.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_02);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_03.m_data = (char *)pQVar6;
    latin1_03.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_03);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_04.m_data = (char *)pQVar6;
    latin1_04.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_04);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_05.m_data = (char *)pQVar6;
    latin1_05.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_05);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_06.m_data = (char *)pQVar6;
    latin1_06.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_06);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_07.m_data = (char *)pQVar6;
    latin1_07.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_07);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_08.m_data = (char *)pQVar6;
    latin1_08.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_08);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_09.m_data = (char *)pQVar6;
    latin1_09.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_09);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_10.m_data = (char *)pQVar6;
    latin1_10.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_10);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_11.m_data = (char *)pQVar6;
    latin1_11.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_11);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_12.m_data = (char *)pQVar6;
    latin1_12.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_12);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_13.m_data = (char *)pQVar6;
    latin1_13.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_13);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_14.m_data = (char *)pQVar6;
    latin1_14.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_14);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_15.m_data = (char *)pQVar6;
    latin1_15.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_15);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_16.m_data = (char *)pQVar6;
    latin1_16.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_16);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_17.m_data = (char *)pQVar6;
    latin1_17.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_17);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_18.m_data = (char *)pQVar6;
    latin1_18.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_18);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_19.m_data = (char *)pQVar6;
    latin1_19.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_19);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_20.m_data = (char *)pQVar6;
    latin1_20.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_20);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_21.m_data = (char *)pQVar6;
    latin1_21.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_21);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_22.m_data = (char *)pQVar6;
    latin1_22.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_22);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_23.m_data = (char *)pQVar6;
    latin1_23.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_23);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_24.m_data = (char *)pQVar6;
    latin1_24.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_24);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_25.m_data = (char *)pQVar6;
    latin1_25.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_25);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_26.m_data = (char *)pQVar6;
    latin1_26.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_26);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_27.m_data = (char *)pQVar6;
    latin1_27.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_27);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_28.m_data = (char *)pQVar6;
    latin1_28.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_28);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_29.m_data = (char *)pQVar6;
    latin1_29.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_29);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_30.m_data = (char *)pQVar6;
    latin1_30.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_30);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_31.m_data = (char *)pQVar6;
    latin1_31.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_31);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_32.m_data = (char *)pQVar6;
    latin1_32.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_32);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_33.m_data = (char *)pQVar6;
    latin1_33.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_33);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_34.m_data = (char *)pQVar6;
    latin1_34.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_34);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_35.m_data = (char *)pQVar6;
    latin1_35.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_35);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_36.m_data = (char *)pQVar6;
    latin1_36.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_36);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_37.m_data = (char *)pQVar6;
    latin1_37.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_37);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_38.m_data = (char *)pQVar6;
    latin1_38.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_38);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_39.m_data = (char *)pQVar6;
    latin1_39.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_39);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_40.m_data = (char *)pQVar6;
    latin1_40.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_40);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_41.m_data = (char *)pQVar6;
    latin1_41.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_41);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_42.m_data = (char *)pQVar6;
    latin1_42.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_42);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_43.m_data = (char *)pQVar6;
    latin1_43.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_43);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_44.m_data = (char *)pQVar6;
    latin1_44.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_44);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_45.m_data = (char *)pQVar6;
    latin1_45.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_45);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_46.m_data = (char *)pQVar6;
    latin1_46.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_46);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
    latin1_47.m_data = (char *)pQVar6;
    latin1_47.m_size = (qsizetype)pQVar5;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                     latin1_47);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff5d0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    QString::~QString((QString *)0x10eb87);
    QString::~QString((QString *)0x10eb94);
    QString::~QString((QString *)0x10eba1);
    QString::~QString((QString *)0x10ebae);
    QString::~QString((QString *)0x10ebbb);
    QString::~QString((QString *)0x10ebc8);
    QString::~QString((QString *)0x10ebd5);
    QString::~QString((QString *)0x10ebe2);
    QString::~QString((QString *)0x10ebef);
    QString::~QString((QString *)0x10ebfc);
    QString::~QString((QString *)0x10ec09);
    QString::~QString((QString *)0x10ec16);
    QString::~QString((QString *)0x10ec23);
    QString::~QString((QString *)0x10ec30);
    QString::~QString((QString *)0x10ec3d);
    QString::~QString((QString *)0x10ec4a);
    QString::~QString((QString *)0x10ec57);
    QString::~QString((QString *)0x10ec64);
    QString::~QString((QString *)0x10ec71);
    QString::~QString((QString *)0x10ec7e);
    QString::~QString((QString *)0x10ec8b);
    QString::~QString((QString *)0x10ec98);
    QString::~QString((QString *)0x10eca5);
    QString::~QString((QString *)0x10ecb2);
    QString::~QString((QString *)0x10ecbf);
    QString::~QString((QString *)0x10eccc);
    QString::~QString((QString *)0x10ecd9);
    QString::~QString((QString *)0x10ece6);
    QString::~QString((QString *)0x10ecf3);
    QString::~QString((QString *)0x10ed00);
    QString::~QString((QString *)0x10ed0d);
    QString::~QString((QString *)0x10ed1a);
    QString::~QString((QString *)0x10ed27);
    QString::~QString((QString *)0x10ed34);
    QString::~QString((QString *)0x10ed41);
    QString::~QString((QString *)0x10ed4e);
    QString::~QString((QString *)0x10ed5b);
    QString::~QString((QString *)0x10ed68);
    QString::~QString((QString *)0x10ed75);
    QString::~QString((QString *)0x10ed82);
    QString::~QString((QString *)0x10ed8f);
    QString::~QString((QString *)0x10ed9c);
    QString::~QString((QString *)0x10eda9);
    QString::~QString((QString *)0x10edb6);
    QString::~QString((QString *)0x10edc3);
    QString::~QString((QString *)0x10edd0);
    QString::~QString((QString *)0x10eddd);
    QString::~QString((QString *)0x10edea);
    QString::~QString((QString *)0x10edf7);
    QString::~QString((QString *)0x10ee04);
  }
  local_850 = (anon_class_1_0_00000001 *)0xffffffffffffffff;
  do {
    qVar7 = QString::size(in_RSI);
    if (qVar7 <= (long)local_850) {
      QString::QString((QString *)in_stack_fffffffffffff5d0,
                       (QString *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    QChar::QChar<char16_t,_true>(local_4c2,L'.');
    local_858 = (anon_class_1_0_00000001 *)
                QString::indexOf((QString *)in_stack_fffffffffffff5d8,
                                 (QChar)(char16_t)((ulong)in_stack_fffffffffffff5f8 >> 0x30),
                                 (qsizetype)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc);
    if (local_858 == (anon_class_1_0_00000001 *)0xffffffffffffffff) {
      local_858 = (anon_class_1_0_00000001 *)QString::size(in_RSI);
    }
    local_4e0 = 0xaaaaaaaaaaaaaaaa;
    local_4d8 = 0xaaaaaaaaaaaaaaaa;
    local_4d0 = 0xaaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_4e0,(longlong)in_RSI);
    bVar1 = QString::isEmpty((QString *)0x10ef0a);
    if (bVar1) {
LAB_0010f04c:
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)in_stack_fffffffffffff5d8,
                         (QString *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc);
      if (bVar1) {
        in_stack_fffffffffffff5d0 = local_858;
        QVar9 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff5d8,(size_t)local_858);
        local_870 = (char *)QVar9.m_size;
        QVar10.m_data = local_870;
        QVar10.m_size = (qsizetype)in_stack_fffffffffffff5d0;
        QString::insert((longlong)in_RSI,QVar10);
        if (in_RDX != (undefined1 *)0x0) {
          *in_RDX = 1;
        }
        local_850 = local_858 + 1;
      }
      else {
        local_850 = local_858;
      }
    }
    else {
      local_4e2 = 0xaaaa;
      pQVar8 = QString::operator[]((QString *)
                                   CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                                   0x10ef32);
      local_4e2 = pQVar8->ucs;
      QChar::QChar<char16_t,_true>(&local_4e4,L'0');
      bVar1 = operator>=((QChar *)in_stack_fffffffffffff5d0,
                         (QChar *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      if (bVar1) {
        QChar::QChar<char16_t,_true>(&local_4e6,L'9');
        bVar1 = operator<=((QChar *)in_stack_fffffffffffff5d0,
                           (QChar *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        bVar2 = true;
        if (!bVar1) goto LAB_0010ef9e;
      }
      else {
LAB_0010ef9e:
        QChar::QChar<char16_t,_true>(&local_4e8,L'_');
        bVar2 = operator==((QChar *)in_stack_fffffffffffff5d0,
                           (QChar *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      }
      if (bVar2 == false) goto LAB_0010f04c;
      in_stack_fffffffffffff5d8 = local_850 + 1;
      QChar::QChar<char16_t,_true>(&local_4ea,L'a');
      QString::insert((longlong)in_RSI,(QChar)(char16_t)in_stack_fffffffffffff5d8);
      if (in_RDX != (undefined1 *)0x0) {
        *in_RDX = 1;
      }
      local_850 = local_858 + 1;
    }
    QString::~QString((QString *)0x10f10f);
  } while( true );
}

Assistant:

QString cleanPackageName(QString packageName, bool *cleaned = nullptr)
{
    auto isLegalChar = [] (QChar c) -> bool {
        ushort ch = c.unicode();
        return (ch >= '0' && ch <= '9') ||
                (ch >= 'A' && ch <= 'Z') ||
                (ch >= 'a' && ch <= 'z') ||
                ch == '.' || ch == '_';
    };

    if (cleaned)
        *cleaned = false;

    for (QChar &c : packageName) {
        if (!isLegalChar(c)) {
            c = u'_';
            if (cleaned)
                *cleaned = true;
        }
    }

    static QStringList keywords;
    if (keywords.isEmpty()) {
        keywords << "abstract"_L1 << "continue"_L1 << "for"_L1
                 << "new"_L1 << "switch"_L1 << "assert"_L1
                 << "default"_L1 << "if"_L1 << "package"_L1
                 << "synchronized"_L1 << "boolean"_L1 << "do"_L1
                 << "goto"_L1 << "private"_L1 << "this"_L1
                 << "break"_L1 << "double"_L1 << "implements"_L1
                 << "protected"_L1 << "throw"_L1 << "byte"_L1
                 << "else"_L1 << "import"_L1 << "public"_L1
                 << "throws"_L1 << "case"_L1 << "enum"_L1
                 << "instanceof"_L1 << "return"_L1 << "transient"_L1
                 << "catch"_L1 << "extends"_L1 << "int"_L1
                 << "short"_L1 << "try"_L1 << "char"_L1
                 << "final"_L1 << "interface"_L1 << "static"_L1
                 << "void"_L1 << "class"_L1 << "finally"_L1
                 << "long"_L1 << "strictfp"_L1 << "volatile"_L1
                 << "const"_L1 << "float"_L1 << "native"_L1
                 << "super"_L1 << "while"_L1;
    }

    // No keywords
    qsizetype index = -1;
    while (index < packageName.size()) {
        qsizetype next = packageName.indexOf(u'.', index + 1);
        if (next == -1)
            next = packageName.size();
        QString word = packageName.mid(index + 1, next - index - 1);
        if (!word.isEmpty()) {
            QChar c = word[0];
            if ((c >= u'0' && c <= u'9') || c == u'_') {
                packageName.insert(index + 1, u'a');
                if (cleaned)
                    *cleaned = true;
                index = next + 1;
                continue;
            }
        }
        if (keywords.contains(word)) {
            packageName.insert(next, "_"_L1);
            if (cleaned)
                *cleaned = true;
            index = next + 1;
        } else {
            index = next;
        }
    }

    return packageName;
}